

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O2

void __thiscall read_surfmap::operator()(read_surfmap *this,xr_surfmap **_smap,xr_reader *r)

{
  xr_object *this_00;
  uint *puVar1;
  xr_surfmap *pxVar2;
  char *__s;
  xr_surface *pxVar3;
  allocator<char> local_41;
  string local_40;
  
  pxVar2 = (xr_surfmap *)operator_new(0x20);
  pxVar2->surface = (xr_surface *)0x0;
  (pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar2->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_smap = pxVar2;
  __s = xray_re::xr_reader::skip_sz(r);
  this_00 = this->object;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  pxVar3 = xray_re::xr_object::find_surface(this_00,&local_40);
  pxVar2->surface = pxVar3;
  std::__cxx11::string::~string((string *)&local_40);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  xray_re::xr_reader::r_seq<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (r,(ulong)*puVar1,&pxVar2->faces);
  return;
}

Assistant:

void operator()(xr_surfmap*& _smap, xr_reader& r) const {
		xr_surfmap* smap = new xr_surfmap;
		_smap = smap;
		const char* name = r.skip_sz();
		smap->surface = object.find_surface(name);
		r.r_seq(r.r_u32(), smap->faces);
	}